

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uspoof_impl.cpp
# Opt level: O3

UBool icu_63::spoofDataIsAcceptable(void *context,char *param_2,char *param_3,UDataInfo *pInfo)

{
  UBool UVar1;
  
  if (((((pInfo->size < 0x14) || (pInfo->isBigEndian != '\0')) || (pInfo->charsetFamily != '\0')) ||
      ((pInfo->dataFormat[0] != 'C' || (pInfo->dataFormat[1] != 'f')))) ||
     ((pInfo->dataFormat[2] != 'u' ||
      ((pInfo->dataFormat[3] != ' ' || (pInfo->formatVersion[0] != '\x02')))))) {
    UVar1 = '\0';
  }
  else {
    UVar1 = '\x01';
    if (context != (void *)0x0) {
      *(undefined4 *)context = *(undefined4 *)pInfo->dataVersion;
      return '\x01';
    }
  }
  return UVar1;
}

Assistant:

static UBool U_CALLCONV
spoofDataIsAcceptable(void *context,
                        const char * /* type */, const char * /*name*/,
                        const UDataInfo *pInfo) {
    if(
        pInfo->size >= 20 &&
        pInfo->isBigEndian == U_IS_BIG_ENDIAN &&
        pInfo->charsetFamily == U_CHARSET_FAMILY &&
        pInfo->dataFormat[0] == 0x43 &&  // dataFormat="Cfu "
        pInfo->dataFormat[1] == 0x66 &&
        pInfo->dataFormat[2] == 0x75 &&
        pInfo->dataFormat[3] == 0x20 &&
        pInfo->formatVersion[0] == USPOOF_CONFUSABLE_DATA_FORMAT_VERSION
    ) {
        UVersionInfo *version = static_cast<UVersionInfo *>(context);
        if(version != NULL) {
            uprv_memcpy(version, pInfo->dataVersion, 4);
        }
        return TRUE;
    } else {
        return FALSE;
    }
}